

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseExtKR_ParameterDeclaration
          (Parser *this,ExtKR_ParameterDeclarationSyntax **paramDecl)

{
  DeclaratorListSyntax *pDVar1;
  bool bVar2;
  bool bVar3;
  ExtKR_ParameterDeclarationSyntax *pEVar4;
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *pSVar5;
  SyntaxToken *pSVar6;
  IndexType IVar7;
  DeclaratorListSyntax **ppDVar8;
  bool bVar9;
  DeclaratorSyntax *decltor;
  SpecifierListSyntax *specList;
  DeclarationSyntax *decl;
  DeclaratorSyntax *local_48;
  SpecifierListSyntax *local_40;
  DeclarationSyntax *local_38;
  
  bVar9 = false;
  local_38 = (DeclarationSyntax *)0x0;
  local_40 = (SpecifierListSyntax *)0x0;
  bVar2 = parseDeclarationSpecifiers(this,&local_38,&local_40,Unspecified);
  if (bVar2) {
    pEVar4 = makeNode<psy::C::ExtKR_ParameterDeclarationSyntax>(this);
    *paramDecl = pEVar4;
    pEVar4->specs_ = local_40;
    ppDVar8 = &(*paramDecl)->decltors_;
    bVar9 = false;
    do {
      local_48 = (DeclaratorSyntax *)0x0;
      bVar2 = false;
      bVar3 = parseDeclarator(this,&local_48,Parameter,Concrete);
      if (bVar3) {
        pSVar5 = makeNode<psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax*>,psy::C::DeclaratorSyntax*&>
                           (this,&local_48);
        *ppDVar8 = pSVar5;
        pSVar6 = peek(this,1);
        if (pSVar6->syntaxK_ == SemicolonToken) {
          IVar7 = consume(this);
          (*paramDecl)->semicolonTkIdx_ = IVar7;
          bVar9 = true;
        }
        else {
          if (pSVar6->syntaxK_ == CommaToken) {
            IVar7 = consume(this);
            pDVar1 = *ppDVar8;
            pDVar1->delimTkIdx_ = (uint)IVar7;
            ppDVar8 = &(pDVar1->
                       super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                       ).
                       super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                       .next;
            bVar2 = true;
            goto LAB_002c19f1;
          }
          bVar9 = false;
        }
        bVar2 = false;
      }
      else {
        bVar9 = false;
      }
LAB_002c19f1:
    } while (bVar2);
  }
  return bVar9;
}

Assistant:

bool Parser::parseExtKR_ParameterDeclaration(ExtKR_ParameterDeclarationSyntax*& paramDecl)
{
    DBG_THIS_RULE();

    DeclarationSyntax* decl = nullptr;
    SpecifierListSyntax* specList = nullptr;
    if (!parseDeclarationSpecifiers(decl, specList, DeclarationContext::Unspecified))
        return false;

    paramDecl = makeNode<ExtKR_ParameterDeclarationSyntax>();
    paramDecl->specs_ = specList;

    DeclaratorListSyntax** decltorList_cur = &paramDecl->decltors_;
    while (true) {
        DeclaratorSyntax* decltor = nullptr;
        if (!parseDeclarator(decltor, DeclarationContext::Parameter))
            return false;

        *decltorList_cur = makeNode<DeclaratorListSyntax>(decltor);
        switch (peek().kind()) {
            case SyntaxKind::CommaToken:
                (*decltorList_cur)->delimTkIdx_ = consume();
                decltorList_cur = &(*decltorList_cur)->next;
                break;

            case SyntaxKind::SemicolonToken:
                paramDecl->semicolonTkIdx_ = consume();
                return true;

            default:
                return false;
        }
    }
}